

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grafika2.cpp
# Opt level: O2

void line(int x0,int y0,int x1,int y1)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  
  uVar3 = x1 - x0;
  uVar1 = -uVar3;
  if (0 < (int)uVar3) {
    uVar1 = uVar3;
  }
  uVar5 = (uint)(uVar3 != 0) | (int)uVar3 >> 0x1f;
  uVar4 = y1 - y0;
  uVar3 = -uVar4;
  if (0 < (int)uVar4) {
    uVar3 = uVar4;
  }
  uVar4 = (uint)(uVar4 != 0) | (int)uVar4 >> 0x1f;
  setWarna(x0,y0);
  if (uVar1 < uVar3) {
    iVar6 = uVar1 * 2 - uVar3;
    uVar2 = 0;
    iVar7 = 0;
    if (0 < iVar6) {
      uVar2 = uVar5;
      iVar7 = uVar3 * 2;
    }
    iVar6 = iVar6 - iVar7;
    iVar8 = uVar2 + x0;
    for (iVar7 = y0 + uVar4; iVar7 != y1; iVar7 = iVar7 + uVar4) {
      setWarna(iVar8,iVar7);
      for (iVar6 = iVar6 + uVar1 * 2; 0 < iVar6; iVar6 = iVar6 + uVar3 * -2) {
        iVar8 = iVar8 + uVar5;
      }
    }
  }
  else {
    iVar6 = uVar3 * 2 - uVar1;
    uVar2 = 0;
    iVar7 = 0;
    if (0 < iVar6) {
      uVar2 = uVar4;
      iVar7 = uVar1 * 2;
    }
    iVar6 = iVar6 - iVar7;
    iVar8 = uVar2 + y0;
    for (iVar7 = x0 + uVar5; iVar7 != x1; iVar7 = iVar7 + uVar5) {
      setWarna(iVar7,iVar8);
      for (iVar6 = iVar6 + uVar3 * 2; 0 < iVar6; iVar6 = iVar6 + uVar1 * -2) {
        iVar8 = iVar8 + uVar4;
      }
    }
  }
  return;
}

Assistant:

void line(int x0, int y0, int x1, int y1)
{
  int deltax = x1 - x0;
  int adx = abs(deltax);
  int dx = sign(deltax);

  int deltay = y1 - y0;
  int ady = abs(deltay);
  int dy = sign(deltay);

  setWarna(x0, y0);
  if (adx < ady) {
    int D = 2 * adx - ady;
    int x = x0;
    if (D > 0) {
      x += dx;
      D -= 2 * ady;
    }

    for (int y = y0 + dy; y != y1; y += dy) {
      setWarna(x, y);
      D += 2 * adx;
      while (D > 0) {
        x += dx;
        D -= 2 * ady;
      }
    }
  }
  else {
    int D = 2 * ady - adx;    
    int y = y0;
    if (D > 0) {
      y += dy;
      D -= 2 * adx;
    }

    for (int x = x0 + dx; x != x1; x += dx) {
      setWarna(x, y);
      D += 2 * ady;
      while (D > 0) {
        y += dy;
        D -= 2 * adx;
      }
    }
  }
}